

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O1

void __thiscall qpdf::Tokenizer::inNameHex2(Tokenizer *this,char ch)

{
  byte bVar1;
  char cVar2;
  
  bVar1 = ch - 0x30U;
  if (9 < (byte)(ch - 0x30U)) {
    if (ch < 'a') {
      bVar1 = 0x10;
      if ('@' < ch) {
        bVar1 = ch - 0x37;
      }
    }
    else {
      bVar1 = ch + 0xa9;
    }
  }
  if ((char)bVar1 < '\x10') {
    this->char_code = this->char_code | (int)(char)bVar1;
    if (this->char_code == 0) {
      std::__cxx11::string::_M_replace
                ((ulong)&this->error_message,0,(char *)(this->error_message)._M_string_length,
                 0x27e2d7);
      std::__cxx11::string::append((char *)&this->val);
      this->state = st_name;
      this->bad = true;
    }
    else {
      std::__cxx11::string::push_back((char)this + '\x10');
      this->state = st_name;
    }
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)&this->error_message,0,(char *)(this->error_message)._M_string_length,0x27e2a7
              );
    cVar2 = (char)this + '\x10';
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar2);
    this->state = st_name;
    inName(this,ch);
  }
  return;
}

Assistant:

void
Tokenizer::inNameHex2(char ch)
{
    if (char hval = util::hex_decode_char(ch); hval < '\20') {
        char_code |= int(hval);
    } else {
        QTC::TC("qpdf", "QPDFTokenizer bad name 2");
        error_message = "name with stray # will not work with PDF >= 1.2";
        // Use null to encode a bad # -- this is reversed in QPDF_Name::normalizeName.
        val += '\0';
        val += hex_char;
        state = st_name;
        inName(ch);
        return;
    }
    if (char_code == 0) {
        QTC::TC("qpdf", "QPDFTokenizer null in name");
        error_message = "null character not allowed in name token";
        val += "#00";
        state = st_name;
        bad = true;
    } else {
        val += char(char_code);
        state = st_name;
    }
}